

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  _Setprecision _Var2;
  ostream *poVar3;
  istream *piVar4;
  element_type *peVar5;
  double value;
  logic_error *e;
  double result;
  shared_ptr<calc::Node> ast;
  undefined1 local_60 [8];
  vector<calc::Token,_std::allocator<calc::Token>_> tokens;
  string local_38 [8];
  string expression;
  char **argv_local;
  int argc_local;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"abac console calculator v1.0");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"To exit enter \"exit\"");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Enter arithmetic expression: ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,":> ");
  std::__cxx11::string::string(local_38);
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,local_38);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if ((!bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"exit"), bVar1)) break;
    std::__cxx11::string::string
              ((string *)&ast.super___shared_ptr<calc::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,local_38);
    calc::tokenize((vector<calc::Token,_std::allocator<calc::Token>_> *)local_60,
                   (string *)
                   &ast.super___shared_ptr<calc::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string
              ((string *)&ast.super___shared_ptr<calc::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    calc::buildAST((calc *)&result,(vector<calc::Token,_std::allocator<calc::Token>_> *)local_60);
    peVar5 = std::__shared_ptr_access<calc::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<calc::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&result);
    (**peVar5->_vptr_Node)();
    bVar1 = isInteger(value);
    if (bVar1) {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,value);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::fixed);
      _Var2 = std::setprecision(2);
      poVar3 = std::operator<<(poVar3,_Var2);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,value);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    std::shared_ptr<calc::Node>::~shared_ptr((shared_ptr<calc::Node> *)&result);
    std::vector<calc::Token,_std::allocator<calc::Token>_>::~vector
              ((vector<calc::Token,_std::allocator<calc::Token>_> *)local_60);
    std::operator<<((ostream *)&std::cout,":> ");
  }
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	cout << "abac console calculator v1.0" << endl;
	cout << "To exit enter \"exit\"" << endl;
	cout << "Enter arithmetic expression: " << endl;
	cout << ":> ";
	string expression;
	while (getline(cin, expression))
	{
		if (expression == "exit")
			break;
		try
		{
			const auto tokens = calc::tokenize(expression);
			const auto ast = calc::buildAST(tokens);
			double result = ast->eval();
			if (isInteger(result))
			{
				cout << result << endl;
			}
			else
			{
				cout << fixed << setprecision(2) << result << endl;
			}
		}
		catch (logic_error & e)
		{
			cout << "Error: " << e.what() << endl;
		}
		cout << ":> ";
	}

	return 0;
}